

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBB.cpp
# Opt level: O3

bool chrono::collision::CHOBB::OBB_Overlap(ChMatrix33<double> *B,Vector *T,Vector *a,Vector *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  
  if (OBB_Overlap(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::ChVector<double>,chrono::ChVector<double>)
      ::Bf == '\0') {
    OBB_Overlap();
  }
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (B->super_Matrix<double,_3,_3,_1,_3,_3>).
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar22 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (B->super_Matrix<double,_3,_3,_1,_3,_3>).
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = a->m_data[0];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = b->m_data[2];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = T->m_data[0];
  auVar23 = vxorpd_avx512vl(auVar28,auVar22);
  auVar24 = vxorpd_avx512vl(auVar38,auVar22);
  auVar23 = vmaxsd_avx(auVar23,auVar28);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = b->m_data[0];
  auVar28 = vmaxsd_avx(auVar24,auVar38);
  auVar25 = vaddsd_avx512f(auVar23,ZEXT816(0x3eb0c6f7a0b5ed8d));
  auVar23 = vxorpd_avx512vl(auVar29,auVar22);
  auVar23 = vmaxsd_avx(auVar23,auVar29);
  auVar26 = vaddsd_avx512f(auVar23,ZEXT816(0x3eb0c6f7a0b5ed8d));
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (B->super_Matrix<double,_3,_3,_1,_3,_3>).
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar29 = vfmadd213sd_fma(auVar25,auVar40,auVar41);
  auVar23 = vxorpd_avx512vl(auVar27,auVar22);
  auVar23 = vmaxsd_avx(auVar23,auVar27);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = b->m_data[1];
  auVar32 = ZEXT816(0x3eb0c6f7a0b5ed8d);
  auVar27 = vaddsd_avx512f(auVar23,auVar32);
  auVar23 = vfmadd231sd_fma(auVar29,auVar39,auVar26);
  auVar23 = vfmadd231sd_fma(auVar23,auVar43,auVar27);
  bVar12 = auVar28._0_8_ <= auVar23._0_8_;
  if (bVar12) {
    auVar30._8_8_ = 0;
    auVar30._0_8_ =
         (B->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar1;
    auVar49._8_8_ = 0;
    auVar49._0_8_ =
         (B->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    dVar2 = T->m_data[2];
    dVar3 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar28 = vfmadd213sd_avx512f(auVar25,auVar41,auVar40);
    dVar4 = a->m_data[2];
    auVar23 = vxorpd_avx512vl(auVar30,auVar22);
    auVar23 = vmaxsd_avx(auVar23,auVar30);
    auVar29 = vaddsd_avx512f(auVar23,auVar32);
    auVar31._8_8_ = 0;
    auVar31._0_8_ =
         (B->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar23 = vxorpd_avx512vl(auVar31,auVar22);
    auVar23 = vmaxsd_avx(auVar23,auVar31);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = T->m_data[1];
    auVar30 = vaddsd_avx512f(auVar23,auVar32);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = T->m_data[1] * dVar1;
    auVar23 = vfmadd231sd_fma(auVar33,auVar38,auVar49);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = dVar3;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar2;
    auVar31 = vfmadd231sd_avx512f(auVar23,auVar35,auVar60);
    auVar23._8_8_ = 0x8000000000000000;
    auVar23._0_8_ = 0x8000000000000000;
    auVar23 = vxorpd_avx512vl(auVar31,auVar23);
    auVar23 = vmaxsd_avx(auVar23,auVar31);
    dVar5 = a->m_data[1];
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar5;
    auVar28 = vfmadd231sd_avx512f(auVar28,auVar37,auVar29);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar4;
    vfmadd231sd_avx512f(auVar28,auVar34,auVar30);
    vucomisd_avx512f(auVar23);
    if (bVar12) {
      auVar47._8_8_ = 0;
      auVar47._0_8_ =
           (B->super_Matrix<double,_3,_3,_1,_3,_3>).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar23 = vfmadd213sd_avx512f(auVar29,auVar40,auVar37);
      auVar53._8_8_ = 0x8000000000000000;
      auVar53._0_8_ = 0x8000000000000000;
      auVar28 = vxorpd_avx512vl(auVar45,auVar53);
      auVar31 = vxorpd_avx512vl(auVar47,auVar22);
      auVar31 = vmaxsd_avx512f(auVar31,auVar47);
      auVar32 = vaddsd_avx512f(auVar31,auVar32);
      auVar48._8_8_ = 0;
      auVar48._0_8_ =
           (B->super_Matrix<double,_3,_3,_1,_3,_3>).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar23 = vfmadd231sd_avx512f(auVar23,auVar39,auVar32);
      auVar31 = vxorpd_avx512vl(auVar48,auVar22);
      auVar31 = vmaxsd_avx512f(auVar31,auVar48);
      auVar33 = vmaxsd_avx512f(auVar28,auVar45);
      auVar53 = ZEXT816(0x3eb0c6f7a0b5ed8d);
      auVar31 = vaddsd_avx512f(auVar31,auVar53);
      vfmadd231sd_avx512f(auVar23,auVar43,auVar31);
      vucomisd_avx512f(auVar33);
      if (bVar12) {
        auVar13._8_8_ = 0x8000000000000000;
        auVar13._0_8_ = 0x8000000000000000;
        auVar23 = vxorpd_avx512vl(auVar35,auVar13);
        auVar50._8_8_ = 0;
        auVar50._0_8_ =
             (B->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
        auVar33 = vxorpd_avx512vl(auVar50,auVar22);
        auVar33 = vmaxsd_avx512f(auVar33,auVar50);
        auVar33 = vaddsd_avx512f(auVar33,auVar53);
        auVar55._8_8_ = 0;
        auVar55._0_8_ =
             (B->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
        auVar22 = vxorpd_avx512vl(auVar55,auVar22);
        auVar22 = vmaxsd_avx512f(auVar22,auVar55);
        auVar34 = vfmadd213sd_avx512f(auVar30,auVar40,auVar34);
        auVar22 = vaddsd_avx512f(auVar22,auVar53);
        auVar64._8_8_ = 0;
        auVar64._0_8_ = dVar2;
        auVar35 = vmaxsd_avx512f(auVar23,auVar64);
        auVar34 = vfmadd231sd_avx512f(auVar34,auVar39,auVar33);
        vfmadd231sd_avx512f(auVar34,auVar43,auVar22);
        vucomisd_avx512f(auVar35);
        if (bVar12) {
          dVar6 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
          dVar7 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1];
          dVar8 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7];
          auVar58._8_8_ = 0;
          auVar58._0_8_ = dVar6;
          auVar34 = vmulsd_avx512f(auVar45,auVar58);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = dVar7;
          auVar34 = vfmadd231sd_avx512f(auVar34,auVar38,auVar54);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = dVar8;
          auVar34 = vfmadd231sd_avx512f(auVar34,auVar64,auVar66);
          auVar14._8_8_ = 0x8000000000000000;
          auVar14._0_8_ = 0x8000000000000000;
          auVar35 = vxorpd_avx512vl(auVar34,auVar14);
          auVar34 = vmaxsd_avx512f(auVar35,auVar34);
          auVar35 = vfmadd213sd_avx512f(auVar26,auVar41,auVar39);
          auVar35 = vfmadd231sd_avx512f(auVar35,auVar37,auVar32);
          auVar51._8_8_ = 0;
          auVar51._0_8_ = dVar4;
          vfmadd231sd_avx512f(auVar35,auVar51,auVar33);
          vucomisd_avx512f(auVar34);
          if (bVar12) {
            dVar9 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[5];
            dVar10 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
            dVar11 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
            auVar62._8_8_ = 0;
            auVar62._0_8_ = dVar9;
            auVar34 = vmulsd_avx512f(auVar45,auVar62);
            auVar56._8_8_ = 0;
            auVar56._0_8_ = dVar10;
            auVar34 = vfmadd231sd_avx512f(auVar34,auVar38,auVar56);
            auVar68._8_8_ = 0;
            auVar68._0_8_ = dVar11;
            auVar34 = vfmadd231sd_avx512f(auVar34,auVar64,auVar68);
            auVar15._8_8_ = 0x8000000000000000;
            auVar15._0_8_ = 0x8000000000000000;
            auVar35 = vxorpd_avx512vl(auVar34,auVar15);
            auVar34 = vmaxsd_avx512f(auVar35,auVar34);
            auVar35 = vfmadd213sd_avx512f(auVar27,auVar41,auVar43);
            auVar35 = vfmadd231sd_avx512f(auVar35,auVar37,auVar31);
            vfmadd231sd_avx512f(auVar35,auVar51,auVar22);
            vucomisd_avx512f(auVar34);
            if (bVar12) {
              auVar34 = vmulsd_avx512f(auVar60,auVar28);
              auVar36 = vfmadd231sd_avx512f(auVar34,auVar64,auVar36);
              auVar16._8_8_ = 0x8000000000000000;
              auVar16._0_8_ = 0x8000000000000000;
              auVar34 = vxorpd_avx512vl(auVar36,auVar16);
              auVar36 = vmaxsd_avx512f(auVar34,auVar36);
              auVar34 = vmulsd_avx512f(auVar29,auVar51);
              auVar34 = vfmadd231sd_avx512f(auVar34,auVar37,auVar30);
              auVar34 = vfmadd231sd_avx512f(auVar34,auVar39,auVar27);
              vfmadd231sd_avx512f(auVar34,auVar43,auVar26);
              vucomisd_avx512f(auVar36);
              if (bVar12) {
                auVar36 = vmulsd_avx512f(auVar66,auVar28);
                auVar65._8_8_ = 0;
                auVar65._0_8_ = dVar2;
                auVar36 = vfmadd231sd_avx512f(auVar36,auVar65,auVar58);
                auVar17._8_8_ = 0x8000000000000000;
                auVar17._0_8_ = 0x8000000000000000;
                auVar34 = vxorpd_avx512vl(auVar36,auVar17);
                auVar36 = vmaxsd_avx512f(auVar34,auVar36);
                auVar34 = vmulsd_avx512f(auVar32,auVar51);
                auVar34 = vfmadd231sd_avx512f(auVar34,auVar37,auVar33);
                auVar34 = vfmadd231sd_avx512f(auVar34,auVar40,auVar27);
                vfmadd231sd_avx512f(auVar34,auVar43,auVar25);
                vucomisd_avx512f(auVar36);
                if (bVar12) {
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = dVar4;
                  auVar36 = vmulsd_avx512f(auVar31,auVar52);
                  auVar28 = vmulsd_avx512f(auVar68,auVar28);
                  auVar37 = vfmadd231sd_avx512f(auVar36,auVar37,auVar22);
                  auVar28 = vfmadd213sd_avx512f(auVar65,auVar62,auVar28);
                  auVar18._8_8_ = 0x8000000000000000;
                  auVar18._0_8_ = 0x8000000000000000;
                  auVar36 = vxorpd_avx512vl(auVar28,auVar18);
                  auVar37 = vfmadd231sd_avx512f(auVar37,auVar40,auVar26);
                  vfmadd231sd_avx512f(auVar37,auVar39,auVar25);
                  auVar28 = vmaxsd_avx512f(auVar36,auVar28);
                  vucomisd_avx512f(auVar28);
                  if (bVar12) {
                    auVar28 = vmulsd_avx512f(auVar25,auVar52);
                    auVar37 = vmulsd_avx512f(auVar49,auVar23);
                    auVar28 = vfmadd231sd_avx512f(auVar28,auVar41,auVar30);
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = dVar3;
                    auVar37 = vfmadd213sd_avx512f(auVar61,auVar38,auVar37);
                    auVar19._8_8_ = 0x8000000000000000;
                    auVar19._0_8_ = 0x8000000000000000;
                    auVar36 = vxorpd_avx512vl(auVar37,auVar19);
                    auVar28 = vfmadd231sd_avx512f(auVar28,auVar39,auVar31);
                    vfmadd231sd_avx512f(auVar28,auVar43,auVar32);
                    auVar28 = vmaxsd_avx512f(auVar36,auVar37);
                    vucomisd_avx512f(auVar28);
                    if (bVar12) {
                      auVar28 = vmulsd_avx512f(auVar26,auVar52);
                      auVar37 = vmulsd_avx512f(auVar54,auVar23);
                      auVar28 = vfmadd231sd_avx512f(auVar28,auVar41,auVar33);
                      auVar67._8_8_ = 0;
                      auVar67._0_8_ = dVar8;
                      auVar37 = vfmadd213sd_avx512f(auVar67,auVar38,auVar37);
                      auVar20._8_8_ = 0x8000000000000000;
                      auVar20._0_8_ = 0x8000000000000000;
                      auVar36 = vxorpd_avx512vl(auVar37,auVar20);
                      auVar28 = vfmadd231sd_avx512f(auVar28,auVar40,auVar31);
                      vfmadd231sd_avx512f(auVar28,auVar43,auVar29);
                      auVar28 = vmaxsd_avx512f(auVar36,auVar37);
                      vucomisd_avx512f(auVar28);
                      if (bVar12) {
                        auVar28 = vmulsd_avx512f(auVar27,auVar52);
                        auVar23 = vmulsd_avx512f(auVar56,auVar23);
                        auVar28 = vfmadd231sd_avx512f(auVar28,auVar41,auVar22);
                        auVar69._8_8_ = 0;
                        auVar69._0_8_ = dVar11;
                        auVar23 = vfmadd213sd_avx512f(auVar69,auVar38,auVar23);
                        auVar21._8_8_ = 0x8000000000000000;
                        auVar21._0_8_ = 0x8000000000000000;
                        auVar38 = vxorpd_avx512vl(auVar23,auVar21);
                        auVar28 = vfmadd231sd_avx512f(auVar28,auVar40,auVar32);
                        vfmadd231sd_avx512f(auVar28,auVar39,auVar29);
                        auVar23 = vmaxsd_avx512f(auVar38,auVar23);
                        vucomisd_avx512f(auVar23);
                        if (bVar12) {
                          auVar44._8_8_ = 0;
                          auVar44._0_8_ = auVar25._0_8_ * dVar5;
                          auVar23 = vfmadd213sd_fma(auVar29,auVar41,auVar44);
                          auVar46._8_8_ = 0;
                          auVar46._0_8_ = dVar1 * auVar24._0_8_;
                          auVar28 = vfmadd213sd_fma(auVar49,auVar45,auVar46);
                          auVar25._8_8_ = 0x8000000000000000;
                          auVar25._0_8_ = 0x8000000000000000;
                          auVar29 = vxorpd_avx512vl(auVar28,auVar25);
                          auVar23 = vfmadd231sd_avx512f(auVar23,auVar39,auVar22);
                          auVar25 = vfmadd231sd_avx512f(auVar23,auVar43,auVar33);
                          auVar23 = vmaxsd_avx(auVar29,auVar28);
                          if (auVar23._0_8_ <= auVar25._0_8_) {
                            auVar59._8_8_ = 0;
                            auVar59._0_8_ = dVar6;
                            auVar23 = vmulsd_avx512f(auVar59,auVar24);
                            auVar42._8_8_ = 0;
                            auVar42._0_8_ = dVar5 * auVar26._0_8_;
                            auVar28 = vfmadd213sd_avx512f(auVar32,auVar41,auVar42);
                            auVar32._8_8_ = 0;
                            auVar32._0_8_ = dVar7;
                            auVar23 = vfmadd213sd_avx512f(auVar32,auVar45,auVar23);
                            auVar26._8_8_ = 0x8000000000000000;
                            auVar26._0_8_ = 0x8000000000000000;
                            auVar29 = vxorpd_avx512vl(auVar23,auVar26);
                            auVar28 = vfmadd213sd_avx512f(auVar22,auVar40,auVar28);
                            auVar28 = vfmadd213sd_avx512f(auVar43,auVar30,auVar28);
                            auVar23 = vmaxsd_avx512f(auVar29,auVar23);
                            if (auVar23._0_8_ <= auVar28._0_8_) {
                              auVar63._8_8_ = 0;
                              auVar63._0_8_ = dVar9;
                              auVar28 = vmulsd_avx512f(auVar63,auVar24);
                              auVar24._8_8_ = 0;
                              auVar24._0_8_ = dVar5 * auVar27._0_8_;
                              auVar23 = vfmadd213sd_fma(auVar31,auVar41,auVar24);
                              auVar57._8_8_ = 0;
                              auVar57._0_8_ = dVar10;
                              auVar28 = vfmadd213sd_avx512f(auVar57,auVar45,auVar28);
                              auVar22._8_8_ = 0x8000000000000000;
                              auVar22._0_8_ = 0x8000000000000000;
                              auVar29 = vxorpd_avx512vl(auVar28,auVar22);
                              auVar23 = vfmadd213sd_avx512f(auVar33,auVar40,auVar23);
                              auVar23 = vfmadd213sd_avx512f(auVar30,auVar39,auVar23);
                              auVar28 = vmaxsd_avx512f(auVar29,auVar28);
                              return auVar28._0_8_ <= auVar23._0_8_;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool CHOBB::OBB_Overlap(ChMatrix33<>& B, Vector T, Vector a, Vector b) {
    double t, s;
    int r;
    static ChMatrix33<> Bf;
    const double reps = (double)1e-6;

    // Vector& a = b1->d;
    // Vector& b = b2->d;

    // Bf = fabs(B)
    Bf(0, 0) = myfabs(B(0, 0));
    Bf(0, 0) += reps;
    Bf(0, 1) = myfabs(B(0, 1));
    Bf(0, 1) += reps;
    Bf(0, 2) = myfabs(B(0, 2));
    Bf(0, 2) += reps;
    Bf(1, 0) = myfabs(B(1, 0));
    Bf(1, 0) += reps;
    Bf(1, 1) = myfabs(B(1, 1));
    Bf(1, 1) += reps;
    Bf(1, 2) = myfabs(B(1, 2));
    Bf(1, 2) += reps;
    Bf(2, 0) = myfabs(B(2, 0));
    Bf(2, 0) += reps;
    Bf(2, 1) = myfabs(B(2, 1));
    Bf(2, 1) += reps;
    Bf(2, 2) = myfabs(B(2, 2));
    Bf(2, 2) += reps;

    // if any of these tests are one-sided, then the polyhedron are disjoint
    r = 1;

    // A1 x A2 = A0
    t = myfabs(T.x());

    r &= (t <= (a.x() + b.x() * Bf(0, 0) + b.y() * Bf(0, 1) + b.z() * Bf(0, 2)));
    if (!r)
        return false;

    // B1 x B2 = B0
    s = T.x() * B(0, 0) + T.y() * B(1, 0) + T.z() * B(2, 0);
    t = myfabs(s);

    r &= (t <= (b.x() + a.x() * Bf(0, 0) + a.y() * Bf(1, 0) + a.z() * Bf(2, 0)));
    if (!r)
        return false;

    // A2 x A0 = A1
    t = myfabs(T.y());

    r &= (t <= (a.y() + b.x() * Bf(1, 0) + b.y() * Bf(1, 1) + b.z() * Bf(1, 2)));
    if (!r)
        return false;

    // A0 x A1 = A2
    t = myfabs(T.z());

    r &= (t <= (a.z() + b.x() * Bf(2, 0) + b.y() * Bf(2, 1) + b.z() * Bf(2, 2)));
    if (!r)
        return false;

    // B2 x B0 = B1
    s = T.x() * B(0, 1) + T.y() * B(1, 1) + T.z() * B(2, 1);
    t = myfabs(s);

    r &= (t <= (b.y() + a.x() * Bf(0, 1) + a.y() * Bf(1, 1) + a.z() * Bf(2, 1)));
    if (!r)
        return false;

    // B0 x B1 = B2
    s = T.x() * B(0, 2) + T.y() * B(1, 2) + T.z() * B(2, 2);
    t = myfabs(s);

    r &= (t <= (b.z() + a.x() * Bf(0, 2) + a.y() * Bf(1, 2) + a.z() * Bf(2, 2)));
    if (!r)
        return false;

    // A0 x B0
    s = T.z() * B(1, 0) - T.y() * B(2, 0);
    t = myfabs(s);

    r &= (t <= (a.y() * Bf(2, 0) + a.z() * Bf(1, 0) + b.y() * Bf(0, 2) +
                b.z() * Bf(0, 1)));
    if (!r)
        return false;

    // A0 x B1
    s = T.z() * B(1, 1) - T.y() * B(2, 1);
    t = myfabs(s);

    r &= (t <= (a.y() * Bf(2, 1) + a.z() * Bf(1, 1) + b.x() * Bf(0, 2) +
                b.z() * Bf(0, 0)));
    if (!r)
        return false;

    // A0 x B2
    s = T.z() * B(1, 2) - T.y() * B(2, 2);
    t = myfabs(s);

    r &= (t <= (a.y() * Bf(2, 2) + a.z() * Bf(1, 2) + b.x() * Bf(0, 1) +
                b.y() * Bf(0, 0)));
    if (!r)
        return false;

    // A1 x B0
    s = T.x() * B(2, 0) - T.z() * B(0, 0);
    t = myfabs(s);

    r &= (t <= (a.x() * Bf(2, 0) + a.z() * Bf(0, 0) + b.y() * Bf(1, 2) +
                b.z() * Bf(1, 1)));
    if (!r)
        return false;

    // A1 x B1
    s = T.x() * B(2, 1) - T.z() * B(0, 1);
    t = myfabs(s);

    r &= (t <= (a.x() * Bf(2, 1) + a.z() * Bf(0, 1) + b.x() * Bf(1, 2) +
                b.z() * Bf(1, 0)));
    if (!r)
        return false;

    // A1 x B2
    s = T.x() * B(2, 2) - T.z() * B(0, 2);
    t = myfabs(s);

    r &= (t <= (a.x() * Bf(2, 2) + a.z() * Bf(0, 2) + b.x() * Bf(1, 1) +
                b.y() * Bf(1, 0)));
    if (!r)
        return false;

    // A2 x B0
    s = T.y() * B(0, 0) - T.x() * B(1, 0);
    t = myfabs(s);

    r &= (t <= (a.x() * Bf(1, 0) + a.y() * Bf(0, 0) + b.y() * Bf(2, 2) +
                b.z() * Bf(2, 1)));
    if (!r)
        return false;

    // A2 x B1
    s = T.y() * B(0, 1) - T.x() * B(1, 1);
    t = myfabs(s);

    r &= (t <= (a.x() * Bf(1, 1) + a.y() * Bf(0, 1) + b.x() * Bf(2, 2) +
                b.z() * Bf(2, 0)));
    if (!r)
        return false;

    // A2 x B2
    s = T.y() * B(0, 2) - T.x() * B(1, 2);
    t = myfabs(s);

    r &= (t <= (a.x() * Bf(1, 2) + a.y() * Bf(0, 2) + b.x() * Bf(2, 1) +
                b.y() * Bf(2, 0)));
    if (!r)
        return false;

    return true;  // no separation: BV collide!!
}